

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O1

void bi_flush(deflate_state *s)

{
  z_Bytef zVar1;
  uint uVar2;
  int iVar3;
  
  if (s->bi_valid == 0x10) {
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (z_Bytef)s->bi_buf;
    zVar1 = *(z_Bytef *)((long)&s->bi_buf + 1);
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = zVar1;
    s->bi_buf = 0;
    iVar3 = 0;
  }
  else {
    if (s->bi_valid < 8) {
      return;
    }
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (z_Bytef)s->bi_buf;
    s->bi_buf = (ushort)*(byte *)((long)&s->bi_buf + 1);
    iVar3 = s->bi_valid + -8;
  }
  s->bi_valid = iVar3;
  return;
}

Assistant:

local void bi_flush(s)
    deflate_state *s;
{
    if (s->bi_valid == 16) {
        put_short(s, s->bi_buf);
        s->bi_buf = 0;
        s->bi_valid = 0;
    } else if (s->bi_valid >= 8) {
        put_byte(s, s->bi_buf);
        s->bi_buf >>= 8;
        s->bi_valid -= 8;
    }
}